

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::HexUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (HexUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  long lVar2;
  HexUhugeIntOperator *pHVar3;
  char *pcVar4;
  HexUhugeIntOperator *pHVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  string_t target;
  uint local_28;
  undefined4 uStack_24;
  char *local_20;
  
  pHVar5 = (HexUhugeIntOperator *)input.lower;
  lVar2 = 0x3f;
  pHVar3 = pHVar5;
  if ((pHVar5 == (HexUhugeIntOperator *)0x0) &&
     (lVar2 = 0x7f, pHVar3 = this, this == (HexUhugeIntOperator *)0x0)) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = (ulong)pHVar3 >> 1 | (ulong)pHVar3;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar6 = uVar6 >> 0x10 | uVar6;
    uVar6 = (ulong)(lVar2 - *(long *)(&DAT_00780400 +
                                     ((uVar6 >> 0x20 | uVar6) * 0x3f79d71b4cb0a89 >> 0x3a) * 8)) >>
            2;
  }
  if (uVar6 == 0x20) {
    auVar7 = duckdb::StringVector::EmptyString((Vector *)input.upper,1);
    local_20 = auVar7._8_8_;
    local_28 = auVar7._0_4_;
    uStack_24 = auVar7._4_4_;
    pcVar4 = local_20;
    if (local_28 < 0xd) {
      pcVar4 = (char *)&uStack_24;
    }
    *pcVar4 = '0';
  }
  else {
    auVar7 = duckdb::StringVector::EmptyString((Vector *)input.upper,0x20 - uVar6);
    local_20 = auVar7._8_8_;
    local_28 = auVar7._0_4_;
    uStack_24 = auVar7._4_4_;
    pcVar4 = local_20;
    if (local_28 < 0xd) {
      pcVar4 = (char *)&uStack_24;
    }
    for (uVar6 = (0x20 - uVar6) * 4; 0x43 < uVar6; uVar6 = uVar6 - 4) {
      *pcVar4 = "0123456789ABCDEF"[(uint)((ulong)pHVar5 >> ((char)uVar6 + 0xbcU & 0x3f)) & 0xf];
      pcVar4 = pcVar4 + 1;
    }
    if (uVar6 != 0) {
      lVar2 = uVar6 - 4;
      do {
        *pcVar4 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar2 & 0x3f)) & 0xf];
        pcVar4 = pcVar4 + 1;
        lVar2 = lVar2 + -4;
      } while (lVar2 != -4);
    }
  }
  uVar6 = (ulong)local_28;
  if (uVar6 < 0xd) {
    memset((void *)((long)&uStack_24 + uVar6),0,0xc - uVar6);
  }
  else {
    uStack_24 = *(undefined4 *)local_20;
  }
  aVar1._4_1_ = (undefined1)uStack_24;
  aVar1._5_1_ = uStack_24._1_1_;
  aVar1._6_1_ = uStack_24._2_1_;
  aVar1._7_1_ = uStack_24._3_1_;
  aVar1.pointer.length = local_28;
  aVar1.pointer.ptr = local_20;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<uhugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}